

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeLiteGenerator::GetSingleFileBuildCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  bool bVar1;
  string *psVar2;
  string *__lhs;
  ostream *poVar3;
  ostringstream ss;
  allocator<char> local_1b0 [32];
  ostream local_190;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"CMAKE_MAKE_PROGRAM",local_1b0);
  psVar2 = cmMakefile::GetRequiredDefinition(mf,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"CMAKE_GENERATOR",local_1b0);
  __lhs = cmMakefile::GetSafeDefinition(mf,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  bVar1 = std::operator==(__lhs,"Unix Makefiles");
  if ((!bVar1) && (bVar1 = std::operator==(__lhs,"MinGW Makefiles"), !bVar1)) {
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  poVar3 = std::operator<<(&local_190,(string *)psVar2);
  std::operator<<(poVar3," -f$(ProjectPath)/Makefile -B $(CurrentFileFullName).o");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetSingleFileBuildCommand(
  const cmMakefile* mf) const
{
  std::string buildCommand;
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  if (generator == "Unix Makefiles" || generator == "MinGW Makefiles") {
    std::ostringstream ss;
#if defined(_WIN32)
    ss << make << " -f$(ProjectPath)/Makefile -B $(CurrentFileFullName).obj";
#else
    ss << make << " -f$(ProjectPath)/Makefile -B $(CurrentFileFullName).o";
#endif
    buildCommand = ss.str();
  }
  return buildCommand;
}